

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_textedit_find_charpos
               (nk_text_find *find,nk_text_edit *state,int n,int single_line,nk_user_font *font,
               float row_height)

{
  int iVar1;
  int iVar2;
  int iVar3;
  float fVar4;
  nk_text_edit_row r;
  
  iVar3 = (state->string).len;
  nk_zero(&r,0x18);
  if (iVar3 == n) {
    nk_textedit_layout_row(&r,state,0,row_height,font);
    if (single_line == 0) {
      iVar3 = 0;
      iVar1 = 0;
      while( true ) {
        iVar2 = iVar3;
        if (n <= iVar2) break;
        iVar3 = r.num_chars + iVar2;
        nk_textedit_layout_row(&r,state,iVar3,row_height,font);
        iVar1 = iVar2;
      }
      find->first_char = iVar2;
      n = r.num_chars;
    }
    else {
      find->first_char = 0;
      iVar1 = 0;
    }
    find->length = n;
    find->x = r.x1;
    find->y = r.ymin;
    find->height = r.ymax - r.ymin;
    find->prev_first = iVar1;
  }
  else {
    fVar4 = 0.0;
    iVar3 = 0;
    iVar1 = 0;
    while( true ) {
      find->y = fVar4;
      nk_textedit_layout_row(&r,state,iVar1,row_height,font);
      if (n < r.num_chars + iVar1) break;
      fVar4 = r.baseline_y_delta + find->y;
      iVar3 = iVar1;
      iVar1 = r.num_chars + iVar1;
    }
    find->first_char = iVar1;
    find->length = r.num_chars;
    find->height = r.ymax - r.ymin;
    find->prev_first = iVar3;
    find->x = r.x0;
    for (iVar3 = 0; iVar1 + iVar3 < n; iVar3 = iVar3 + 1) {
      fVar4 = nk_textedit_get_width(state,iVar1,iVar3,font);
      find->x = fVar4 + find->x;
    }
  }
  return;
}

Assistant:

NK_INTERN void
nk_textedit_find_charpos(struct nk_text_find *find, struct nk_text_edit *state,
    int n, int single_line, const struct nk_user_font *font, float row_height)
{
    /* find the x/y location of a character, and remember info about the previous
     * row in case we get a move-up event (for page up, we'll have to rescan) */
    struct nk_text_edit_row r;
    int prev_start = 0;
    int z = state->string.len;
    int i=0, first;

    nk_zero_struct(r);
    if (n == z) {
        /* if it's at the end, then find the last line -- simpler than trying to
        explicitly handle this case in the regular code */
        nk_textedit_layout_row(&r, state, 0, row_height, font);
        if (single_line) {
            find->first_char = 0;
            find->length = z;
        } else {
            while (i < z) {
                prev_start = i;
                i += r.num_chars;
                nk_textedit_layout_row(&r, state, i, row_height, font);
            }

            find->first_char = i;
            find->length = r.num_chars;
        }
        find->x = r.x1;
        find->y = r.ymin;
        find->height = r.ymax - r.ymin;
        find->prev_first = prev_start;
        return;
    }

    /* search rows to find the one that straddles character n */
    find->y = 0;

    for(;;) {
        nk_textedit_layout_row(&r, state, i, row_height, font);
        if (n < i + r.num_chars) break;
        prev_start = i;
        i += r.num_chars;
        find->y += r.baseline_y_delta;
    }

    find->first_char = first = i;
    find->length = r.num_chars;
    find->height = r.ymax - r.ymin;
    find->prev_first = prev_start;

    /* now scan to find xpos */
    find->x = r.x0;
    for (i=0; first+i < n; ++i)
        find->x += nk_textedit_get_width(state, first, i, font);
}